

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O0

void __thiscall expr_param_width_Test::~expr_param_width_Test(expr_param_width_Test *this)

{
  expr_param_width_Test *this_local;
  
  ~expr_param_width_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(expr, param_width) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod1");
    auto &param = mod.parameter("WIDTH", 4);
    param.set_value(4);
    auto &p = mod.port(PortDirection::In, "in", 2);
    EXPECT_NO_THROW(p.set_width_param(param.as<Param>()));
    EXPECT_EQ(p.width(), 4);
}